

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O0

string * __thiscall
TgBot::TgTypeParser::parseMessage_abi_cxx11_
          (string *__return_storage_ptr__,TgTypeParser *this,Ptr *object)

{
  bool bVar1;
  element_type *peVar2;
  string local_8b0;
  allocator local_889;
  string local_888;
  string local_868;
  allocator local_841;
  string local_840;
  allocator local_819;
  string local_818;
  string local_7f8;
  allocator local_7d1;
  string local_7d0;
  allocator local_7a9;
  string local_7a8;
  allocator local_781;
  string local_780;
  allocator local_759;
  string local_758;
  allocator local_731;
  string local_730;
  allocator local_709;
  string local_708;
  allocator local_6e1;
  string local_6e0;
  allocator local_6b9;
  string local_6b8;
  code *local_698;
  undefined8 local_690;
  string local_688;
  allocator local_661;
  string local_660;
  allocator local_639;
  string local_638;
  string local_618;
  allocator local_5f1;
  string local_5f0;
  code *local_5d0;
  undefined8 local_5c8;
  string local_5c0;
  allocator local_599;
  string local_598;
  string local_578;
  allocator local_551;
  string local_550;
  string local_530;
  allocator local_509;
  string local_508;
  string local_4e8;
  allocator local_4c1;
  string local_4c0;
  string local_4a0;
  allocator local_479;
  string local_478;
  string local_458;
  allocator local_431;
  string local_430;
  code *local_410;
  undefined8 local_408;
  string local_400;
  allocator local_3d9;
  string local_3d8;
  string local_3b8;
  allocator local_391;
  string local_390;
  string local_370;
  allocator local_349;
  string local_348;
  string local_328;
  allocator local_301;
  string local_300;
  allocator local_2d9;
  string local_2d8;
  allocator local_2b1;
  string local_2b0;
  allocator local_289;
  string local_288;
  string local_268;
  allocator local_241;
  string local_240;
  allocator local_219;
  string local_218;
  allocator local_1f1;
  string local_1f0;
  allocator local_1c9;
  string local_1c8;
  string local_1a8;
  allocator local_181;
  string local_180;
  string local_160;
  allocator local_139;
  string local_138;
  string local_118;
  allocator local_f1;
  string local_f0;
  allocator local_c9;
  string local_c8;
  string local_a8;
  allocator local_81;
  string local_80;
  allocator local_59;
  string local_58;
  undefined1 local_35;
  allocator local_21;
  __shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_20;
  Ptr *object_local;
  TgTypeParser *this_local;
  string *result;
  
  local_20 = (__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)object
  ;
  object_local = (Ptr *)this;
  this_local = (TgTypeParser *)__return_storage_ptr__;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)object);
  if (bVar1) {
    local_35 = 0;
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'{');
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_58,"message_id",&local_59);
    peVar2 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    appendToJson<int>(this,__return_storage_ptr__,&local_58,&peVar2->messageId);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_80,"from",&local_81);
    peVar2 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    parseUser_abi_cxx11_(&local_a8,this,&peVar2->from);
    appendToJson(this,__return_storage_ptr__,&local_80,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c8,"date",&local_c9);
    peVar2 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    appendToJson<int>(this,__return_storage_ptr__,&local_c8,&peVar2->date);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_f0,"chat",&local_f1);
    peVar2 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    parseChat_abi_cxx11_(&local_118,this,&peVar2->chat);
    appendToJson(this,__return_storage_ptr__,&local_f0,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_138,"forward_from",&local_139);
    peVar2 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    parseUser_abi_cxx11_(&local_160,this,&peVar2->forwardFrom);
    appendToJson(this,__return_storage_ptr__,&local_138,&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_180,"forward_from_chat",&local_181);
    peVar2 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    parseChat_abi_cxx11_(&local_1a8,this,&peVar2->forwardFromChat);
    appendToJson(this,__return_storage_ptr__,&local_180,&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_180);
    std::allocator<char>::~allocator((allocator<char> *)&local_181);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1c8,"forward_from_message_id",&local_1c9);
    peVar2 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    appendToJson<int>(this,__return_storage_ptr__,&local_1c8,&peVar2->forwardFromMessageId);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1f0,"forward_signature",&local_1f1);
    peVar2 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    appendToJson(this,__return_storage_ptr__,&local_1f0,&peVar2->forwardSignature);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_218,"forward_date",&local_219);
    peVar2 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    appendToJson<int>(this,__return_storage_ptr__,&local_218,&peVar2->forwardDate);
    std::__cxx11::string::~string((string *)&local_218);
    std::allocator<char>::~allocator((allocator<char> *)&local_219);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_240,"reply_to_message",&local_241);
    peVar2 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    parseMessage_abi_cxx11_(&local_268,this,&peVar2->replyToMessage);
    appendToJson(this,__return_storage_ptr__,&local_240,&local_268);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_240);
    std::allocator<char>::~allocator((allocator<char> *)&local_241);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_288,"edit_date",&local_289);
    peVar2 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    appendToJson<int>(this,__return_storage_ptr__,&local_288,&peVar2->editDate);
    std::__cxx11::string::~string((string *)&local_288);
    std::allocator<char>::~allocator((allocator<char> *)&local_289);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2b0,"author_signature",&local_2b1);
    peVar2 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    appendToJson(this,__return_storage_ptr__,&local_2b0,&peVar2->authorSignature);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2d8,"text",&local_2d9);
    peVar2 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    appendToJson(this,__return_storage_ptr__,&local_2d8,&peVar2->text);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_300,"audio",&local_301);
    peVar2 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    parseAudio_abi_cxx11_(&local_328,this,&peVar2->audio);
    appendToJson(this,__return_storage_ptr__,&local_300,&local_328);
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)&local_300);
    std::allocator<char>::~allocator((allocator<char> *)&local_301);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_348,"document",&local_349);
    peVar2 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    parseDocument_abi_cxx11_(&local_370,this,&peVar2->document);
    appendToJson(this,__return_storage_ptr__,&local_348,&local_370);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_348);
    std::allocator<char>::~allocator((allocator<char> *)&local_349);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_390,"animation",&local_391);
    peVar2 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    parseAnimation_abi_cxx11_(&local_3b8,this,&peVar2->animation);
    appendToJson(this,__return_storage_ptr__,&local_390,&local_3b8);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::__cxx11::string::~string((string *)&local_390);
    std::allocator<char>::~allocator((allocator<char> *)&local_391);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3d8,"photo",&local_3d9);
    std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              (local_20);
    local_410 = parsePhotoSize_abi_cxx11_;
    local_408 = 0;
    parseArray<TgBot::PhotoSize>
              (&local_400,this,0x3463f0,
               (vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>
                *)0x0);
    appendToJson(this,__return_storage_ptr__,&local_3d8,&local_400);
    std::__cxx11::string::~string((string *)&local_400);
    std::__cxx11::string::~string((string *)&local_3d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_430,"sticker",&local_431);
    peVar2 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    parseSticker_abi_cxx11_(&local_458,this,&peVar2->sticker);
    appendToJson(this,__return_storage_ptr__,&local_430,&local_458);
    std::__cxx11::string::~string((string *)&local_458);
    std::__cxx11::string::~string((string *)&local_430);
    std::allocator<char>::~allocator((allocator<char> *)&local_431);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_478,"video",&local_479);
    peVar2 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    parseVideo_abi_cxx11_(&local_4a0,this,&peVar2->video);
    appendToJson(this,__return_storage_ptr__,&local_478,&local_4a0);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::__cxx11::string::~string((string *)&local_478);
    std::allocator<char>::~allocator((allocator<char> *)&local_479);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_4c0,"contact",&local_4c1);
    peVar2 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    parseContact_abi_cxx11_(&local_4e8,this,&peVar2->contact);
    appendToJson(this,__return_storage_ptr__,&local_4c0,&local_4e8);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_508,"location",&local_509);
    peVar2 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    parseLocation_abi_cxx11_(&local_530,this,&peVar2->location);
    appendToJson(this,__return_storage_ptr__,&local_508,&local_530);
    std::__cxx11::string::~string((string *)&local_530);
    std::__cxx11::string::~string((string *)&local_508);
    std::allocator<char>::~allocator((allocator<char> *)&local_509);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_550,"new_chat_member",&local_551);
    peVar2 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    parseUser_abi_cxx11_(&local_578,this,&peVar2->newChatMember);
    appendToJson(this,__return_storage_ptr__,&local_550,&local_578);
    std::__cxx11::string::~string((string *)&local_578);
    std::__cxx11::string::~string((string *)&local_550);
    std::allocator<char>::~allocator((allocator<char> *)&local_551);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_598,"new_chat_members",&local_599);
    std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              (local_20);
    local_5d0 = parseUser_abi_cxx11_;
    local_5c8 = 0;
    parseArray<TgBot::User>
              (&local_5c0,this,0x33fae0,
               (vector<std::shared_ptr<TgBot::User>,_std::allocator<std::shared_ptr<TgBot::User>_>_>
                *)0x0);
    appendToJson(this,__return_storage_ptr__,&local_598,&local_5c0);
    std::__cxx11::string::~string((string *)&local_5c0);
    std::__cxx11::string::~string((string *)&local_598);
    std::allocator<char>::~allocator((allocator<char> *)&local_599);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_5f0,"left_chat_member",&local_5f1);
    peVar2 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    parseUser_abi_cxx11_(&local_618,this,&peVar2->leftChatMember);
    appendToJson(this,__return_storage_ptr__,&local_5f0,&local_618);
    std::__cxx11::string::~string((string *)&local_618);
    std::__cxx11::string::~string((string *)&local_5f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_5f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_638,"new_chat_title",&local_639);
    peVar2 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    appendToJson(this,__return_storage_ptr__,&local_638,&peVar2->newChatTitle);
    std::__cxx11::string::~string((string *)&local_638);
    std::allocator<char>::~allocator((allocator<char> *)&local_639);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_660,"new_chat_photo",&local_661);
    std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              (local_20);
    local_698 = parsePhotoSize_abi_cxx11_;
    local_690 = 0;
    parseArray<TgBot::PhotoSize>
              (&local_688,this,0x3463f0,
               (vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>
                *)0x0);
    appendToJson(this,__return_storage_ptr__,&local_660,&local_688);
    std::__cxx11::string::~string((string *)&local_688);
    std::__cxx11::string::~string((string *)&local_660);
    std::allocator<char>::~allocator((allocator<char> *)&local_661);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_6b8,"delete_chat_photo",&local_6b9);
    peVar2 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    appendToJson(this,__return_storage_ptr__,&local_6b8,&peVar2->deleteChatPhoto);
    std::__cxx11::string::~string((string *)&local_6b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_6b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_6e0,"group_chat_created",&local_6e1);
    peVar2 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    appendToJson(this,__return_storage_ptr__,&local_6e0,&peVar2->groupChatCreated);
    std::__cxx11::string::~string((string *)&local_6e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_6e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_708,"caption",&local_709);
    peVar2 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    appendToJson(this,__return_storage_ptr__,&local_708,&peVar2->caption);
    std::__cxx11::string::~string((string *)&local_708);
    std::allocator<char>::~allocator((allocator<char> *)&local_709);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_730,"supergroup_chat_created",&local_731);
    peVar2 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    appendToJson(this,__return_storage_ptr__,&local_730,&peVar2->supergroupChatCreated);
    std::__cxx11::string::~string((string *)&local_730);
    std::allocator<char>::~allocator((allocator<char> *)&local_731);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_758,"channel_chat_created",&local_759);
    peVar2 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    appendToJson(this,__return_storage_ptr__,&local_758,&peVar2->channelChatCreated);
    std::__cxx11::string::~string((string *)&local_758);
    std::allocator<char>::~allocator((allocator<char> *)&local_759);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_780,"migrate_to_chat_id",&local_781);
    peVar2 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    appendToJson<long>(this,__return_storage_ptr__,&local_780,&peVar2->migrateToChatId);
    std::__cxx11::string::~string((string *)&local_780);
    std::allocator<char>::~allocator((allocator<char> *)&local_781);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_7a8,"migrate_from_chat_id",&local_7a9);
    peVar2 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    appendToJson<long>(this,__return_storage_ptr__,&local_7a8,&peVar2->migrateFromChatId);
    std::__cxx11::string::~string((string *)&local_7a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_7a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_7d0,"pinned_message",&local_7d1);
    peVar2 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    parseMessage_abi_cxx11_(&local_7f8,this,&peVar2->pinnedMessage);
    appendToJson(this,__return_storage_ptr__,&local_7d0,&local_7f8);
    std::__cxx11::string::~string((string *)&local_7f8);
    std::__cxx11::string::~string((string *)&local_7d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_7d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_818,"connected_website",&local_819);
    peVar2 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    appendToJson(this,__return_storage_ptr__,&local_818,&peVar2->connectedWebsite);
    std::__cxx11::string::~string((string *)&local_818);
    std::allocator<char>::~allocator((allocator<char> *)&local_819);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_840,"invoice",&local_841);
    peVar2 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    parseInvoice_abi_cxx11_(&local_868,this,&peVar2->invoice);
    appendToJson(this,__return_storage_ptr__,&local_840,&local_868);
    std::__cxx11::string::~string((string *)&local_868);
    std::__cxx11::string::~string((string *)&local_840);
    std::allocator<char>::~allocator((allocator<char> *)&local_841);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_888,"successful_payment",&local_889);
    peVar2 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    parseSuccessfulPayment_abi_cxx11_(&local_8b0,this,&peVar2->successfulPayment);
    appendToJson(this,__return_storage_ptr__,&local_888,&local_8b0);
    std::__cxx11::string::~string((string *)&local_8b0);
    std::__cxx11::string::~string((string *)&local_888);
    std::allocator<char>::~allocator((allocator<char> *)&local_889);
    removeLastComma(this,__return_storage_ptr__);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'}');
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

string TgTypeParser::parseMessage(const Message::Ptr& object) const {
    if (!object) {
        return "";
    }
    string result;
    result += '{';
    appendToJson(result, "message_id", object->messageId);
    appendToJson(result, "from", parseUser(object->from));
    appendToJson(result, "date", object->date);
    appendToJson(result, "chat", parseChat(object->chat));
    appendToJson(result, "forward_from", parseUser(object->forwardFrom));
    appendToJson(result, "forward_from_chat", parseChat(object->forwardFromChat));
    appendToJson(result, "forward_from_message_id", object->forwardFromMessageId);
    appendToJson(result, "forward_signature", object->forwardSignature);
    appendToJson(result, "forward_date", object->forwardDate);
    appendToJson(result, "reply_to_message", parseMessage(object->replyToMessage));
    appendToJson(result, "edit_date", object->editDate);
    appendToJson(result, "author_signature", object->authorSignature);
    appendToJson(result, "text", object->text);
    appendToJson(result, "audio", parseAudio(object->audio));
    appendToJson(result, "document", parseDocument(object->document));
    appendToJson(result, "animation", parseAnimation(object->animation));
    appendToJson(result, "photo", parseArray(&TgTypeParser::parsePhotoSize, object->photo));
    appendToJson(result, "sticker", parseSticker(object->sticker));
    appendToJson(result, "video", parseVideo(object->video));
    appendToJson(result, "contact", parseContact(object->contact));
    appendToJson(result, "location", parseLocation(object->location));
    appendToJson(result, "new_chat_member", parseUser(object->newChatMember));
    appendToJson(result, "new_chat_members", parseArray(&TgTypeParser::parseUser, object->newChatMembers));
    appendToJson(result, "left_chat_member", parseUser(object->leftChatMember));
    appendToJson(result, "new_chat_title", object->newChatTitle);
    appendToJson(result, "new_chat_photo", parseArray(&TgTypeParser::parsePhotoSize, object->newChatPhoto));
    appendToJson(result, "delete_chat_photo", object->deleteChatPhoto);
    appendToJson(result, "group_chat_created", object->groupChatCreated);
    appendToJson(result, "caption", object->caption);
    appendToJson(result, "supergroup_chat_created", object->supergroupChatCreated);
    appendToJson(result, "channel_chat_created", object->channelChatCreated);
    appendToJson(result, "migrate_to_chat_id", object->migrateToChatId);
    appendToJson(result, "migrate_from_chat_id", object->migrateFromChatId);
    appendToJson(result, "pinned_message", parseMessage(object->pinnedMessage));
    appendToJson(result, "connected_website", object->connectedWebsite);
    appendToJson(result, "invoice", parseInvoice(object->invoice));
    appendToJson(result, "successful_payment", parseSuccessfulPayment(object->successfulPayment));
    removeLastComma(result);
    result += '}';
    return result;
}